

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

void __thiscall DebugLogHelper::DebugLogHelper(DebugLogHelper *this,string message,MatchFn match)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Logger *this_00;
  iterator iVar6;
  undefined8 *in_RDX;
  long *in_RSI;
  long in_FS_OFFSET;
  code *pcVar7;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &(this->m_message).field_2;
  (this->m_message)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(in_RSI + 2);
  if ((size_type *)*in_RSI == psVar2) {
    lVar4 = in_RSI[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(long *)((long)&(this->m_message).field_2 + 8) = lVar4;
  }
  else {
    (this->m_message)._M_dataplus._M_p = (pointer)*in_RSI;
    (this->m_message).field_2._M_allocated_capacity = *psVar2;
  }
  (this->m_message)._M_string_length = in_RSI[1];
  *in_RSI = (long)psVar2;
  in_RSI[1] = 0;
  *(undefined1 *)(in_RSI + 2) = 0;
  this->m_found = false;
  (this->m_print_connection)._M_node = (_List_node_base *)0x0;
  *(undefined8 *)&(this->m_match).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_match).super__Function_base._M_functor + 8) = 0;
  (this->m_match).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_match)._M_invoker = (_Invoker_type)in_RDX[3];
  if (in_RDX[2] != 0) {
    uVar5 = in_RDX[1];
    *(undefined8 *)&(this->m_match).super__Function_base._M_functor = *in_RDX;
    *(undefined8 *)((long)&(this->m_match).super__Function_base._M_functor + 8) = uVar5;
    (this->m_match).super__Function_base._M_manager = (_Manager_type)in_RDX[2];
    in_RDX[2] = 0;
    in_RDX[3] = 0;
  }
  this_00 = LogInstance();
  pcVar7 = std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.cpp:17:9)>
           ::_M_manager;
  fun.super__Function_base._M_functor._8_8_ = 0;
  fun.super__Function_base._M_functor._M_unused._M_object = this;
  fun.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.cpp:17:9)>
       ::_M_manager;
  fun._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.cpp:17:9)>
       ::_M_invoke;
  iVar6 = BCLog::Logger::PushBackCallback(this_00,fun);
  (this->m_print_connection)._M_node = iVar6._M_node;
  if (pcVar7 != (code *)0x0) {
    (*pcVar7)(&stack0xffffffffffffffb8,&stack0xffffffffffffffb8,3);
  }
  noui_test_redirect();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DebugLogHelper::DebugLogHelper(std::string message, MatchFn match)
    : m_message{std::move(message)}, m_match(std::move(match))
{
    m_print_connection = LogInstance().PushBackCallback(
        [this](const std::string& s) {
            if (m_found) return;
            m_found = s.find(m_message) != std::string::npos && m_match(&s);
        });
    noui_test_redirect();
}